

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getDataFromFile(File *this)

{
  string *this_00;
  long *this_01;
  long lVar1;
  runtime_error *prVar2;
  long in_RSI;
  int *in_R9;
  undefined1 auVar3 [16];
  char local_5c [4];
  string local_58;
  tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  local_38;
  
  local_38.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        )(_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          )this;
  this_01 = (long *)operator_new(0x210);
  std::ios::ios((ios *)(this_01 + 0x21));
  *this_01 = (long)&PTR__offsetifstream_00112ac0;
  this_01[0x21] = (long)&PTR__offsetifstream_00112ae8;
  this_00 = (string *)(this_01 + 2);
  std::istream::istream(this_01,(streambuf *)&PTR_construction_vtable_24__00112b00);
  *this_01 = (long)&PTR__offsetifstream_00112ac0;
  this_01[0x21] = (long)&PTR__offsetifstream_00112ae8;
  std::filebuf::filebuf(this_00);
  this_01[2] = (long)&PTR__filebuf_00112b90;
  this_01[0x20] = 0;
  std::filebuf::open(this_00,(_Ios_Openmode)in_RSI);
  if ((*(byte *)((long)this_01 + *(long *)(*this_01 + -0x18) + 0x20) & 5) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_5c[0] = -0x66;
    local_5c[1] = '\0';
    local_5c[2] = '\0';
    local_5c[3] = '\0';
    util::str<char[28],char[90],char[2],int>
              (&local_58,(util *)"Assertion `*ifs` failed at ",
               (char (*) [28])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/file.cc"
               ,(char (*) [90])":",(char (*) [2])local_5c,in_R9);
    std::runtime_error::runtime_error(prVar2,(string *)&local_58);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::seekg(this_01,*(undefined4 *)(in_RSI + 0x88),0);
  if ((*(byte *)((long)this_01 + *(long *)(*this_01 + -0x18) + 0x20) & 5) == 0) {
    if (*(char *)(in_RSI + 0x84) == '\0') {
      auVar3 = std::istream::tellg();
      std::istream::seekg((long)this_01,_S_beg);
      lVar1 = std::istream::tellg();
      std::istream::seekg(this_01,auVar3._0_8_,auVar3._8_8_);
      lVar1 = lVar1 - (auVar3._0_8_ + (*(long *)(in_RSI + 0x90) * 0x20000000 + 0xe0000000 >> 0x20));
      if (0 < lVar1) {
        std::istream::seekg((long)this_01,(_Ios_Seekdir)lVar1);
        if ((*(byte *)((long)this_01 + *(long *)(*this_01 + -0x18) + 0x20) & 5) != 0) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_5c[0] = -0x51;
          local_5c[1] = '\0';
          local_5c[2] = '\0';
          local_5c[3] = '\0';
          util::str<char[28],char[90],char[2],int>
                    (&local_58,(util *)"Assertion `*ifs` failed at ",
                     (char (*) [28])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/file.cc"
                     ,(char (*) [90])":",(char (*) [2])local_5c,in_R9);
          std::runtime_error::runtime_error(prVar2,(string *)&local_58);
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    lVar1 = (**(code **)(*(long *)this_00 + 0x20))(this_00,0,1,8);
    this_01[0x20] = lVar1;
    *(long **)local_38.
              super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = this_01;
    return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              )local_38.
               super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_5c[0] = -100;
  local_5c[1] = '\0';
  local_5c[2] = '\0';
  local_5c[3] = '\0';
  util::str<char[28],char[90],char[2],int>
            (&local_58,(util *)"Assertion `*ifs` failed at ",
             (char (*) [28])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/file.cc"
             ,(char (*) [90])":",(char (*) [2])local_5c,in_R9);
  std::runtime_error::runtime_error(prVar2,(string *)&local_58);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<std::istream> File::getDataFromFile() const {
  auto ifs = std::make_unique<offsetifstream>(file_);
  ASSERT(*ifs);
  ifs->seekg(ph_.totalHeaderLength);
  ASSERT(*ifs);

  // Because of a bug in goesdec, LRIT image files that used
  // compression have an initial bogus line, followed by the real
  // image. Detect if this is one of those files and ignore the bogus
  // line if so. See 2bd11f16 for more info.
  if (ph_.fileType == 0) {
    // Number of bytes remaining in file
    std::streampos fpos1 = ifs->tellg();
    ifs->seekg(0, std::ios::end);
    std::streampos fpos2 = ifs->tellg();
    ifs->seekg(fpos1);
    // Seek to first byte beyond bogus line
    // Round up (hence the + 7) so that images with 1 bit per pixel
    // and a number of pixels not equal to a power of 8 are not
    // accidentally made 1 byte shorter than expected.
    auto delta = (fpos2 - fpos1) - ((int) ((ph_.dataLength + 7) / 8));
    if (delta > 0) {
      ifs->seekg(delta, ifs->cur);
      ASSERT(*ifs);
    }
  }

  // Current position is the start of the data section,
  // and the 0-offset for other code that uses it.
  ifs->mark();

  return std::unique_ptr<std::istream>(ifs.release());
}